

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codeholder.cpp
# Opt level: O2

void __thiscall asmjit::CodeHolder::setLogger(CodeHolder *this,Logger *logger)

{
  CodeEmitter *pCVar1;
  CodeEmitter **ppCVar2;
  
  this->_logger = logger;
  this->_globalOptions = (this->_globalOptions & 0xfffffffb) + (uint)(logger != (Logger *)0x0) * 4;
  ppCVar2 = &this->_emitters;
  while (pCVar1 = *ppCVar2, pCVar1 != (CodeEmitter *)0x0) {
    pCVar1->_globalOptions =
         pCVar1->_globalOptions & 0xfffffffb | (uint)(logger != (Logger *)0x0) << 2;
    ppCVar2 = &pCVar1->_nextEmitter;
  }
  return;
}

Assistant:

void CodeHolder::setLogger(Logger* logger) noexcept {
  uint32_t opt = 0;
  if (logger) opt = CodeEmitter::kOptionLoggingEnabled;

  _logger = logger;
  CodeHolder_setGlobalOption(this, CodeEmitter::kOptionLoggingEnabled, opt);
}